

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TicsSpecs.hpp
# Opt level: O2

string * __thiscall
sciplot::TicsSpecs::repr_abi_cxx11_(string *__return_storage_ptr__,TicsSpecs *this)

{
  ostream *poVar1;
  string baserepr;
  stringstream ss;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  TicsSpecsBaseOf<sciplot::TicsSpecs>::repr_abi_cxx11_
            (&local_1e0,&this->super_TicsSpecsBaseOf<sciplot::TicsSpecs>);
  if ((this->super_TicsSpecsBaseOf<sciplot::TicsSpecs>).super_ShowSpecsOf<sciplot::TicsSpecs>.m_show
      == false) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_1e0);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar1 = std::operator<<(local_190,(string *)&local_1e0);
    std::operator<<(poVar1," ");
    std::operator<<(local_190,(string *)&this->m_depth);
    std::__cxx11::stringbuf::str();
    internal::removeExtraWhitespaces(__return_storage_ptr__,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  std::__cxx11::string::~string((string *)&local_1e0);
  return __return_storage_ptr__;
}

Assistant:

inline auto TicsSpecs::repr() const -> std::string
{
    const auto baserepr = TicsSpecsBaseOf<TicsSpecs>::repr();

    if(isHidden())
        return baserepr;

    std::stringstream ss;
    ss << baserepr << " ";
    ss << m_depth;
    return internal::removeExtraWhitespaces(ss.str());
}